

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_piece_priority
          (torrent *this,piece_index_t index,download_priority_t priority)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  element_type *this_00;
  pointer this_01;
  bool local_3d;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_20;
  bool filter_updated;
  bool was_finished;
  torrent *local_18;
  torrent *this_local;
  download_priority_t priority_local;
  piece_index_t index_local;
  
  local_18 = this;
  this_local._3_1_ = priority.m_val;
  this_local._4_4_ = index.m_val;
  bVar1 = valid_metadata(this);
  if (!bVar1) {
    uVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
    bVar2 = strong_typedef::operator_cast_to_unsigned_char
                      ((strong_typedef *)((long)&this_local + 3));
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** SET_PIECE_PRIORITY [ idx: %d prio: %d ignored. no metadata yet ]",
               (ulong)uVar4,(ulong)bVar2);
  }
  bVar1 = valid_metadata(this);
  if ((bVar1) && (bVar1 = is_seed(this), !bVar1)) {
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
              ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               &stack0xffffffffffffffe4,0);
    bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                      ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                       ((long)&this_local + 4),
                       (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                       &stack0xffffffffffffffe4);
    local_3d = true;
    if (!bVar1) {
      this_00 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      local_20.m_val = (int)torrent_info::end_piece(this_00);
      local_3d = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                           ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                            ((long)&this_local + 4),&local_20);
    }
    if (local_3d == false) {
      need_picker(this);
      bVar1 = is_finished(this);
      this_01 = ::std::
                unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ::operator->(&(this->super_torrent_hot_members).m_picker);
      bVar3 = piece_picker::set_piece_priority(this_01,this_local._4_4_,this_local._3_1_);
      update_gauge(this);
      if (bVar3) {
        update_peer_interest(this,bVar1);
        bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator==
                          ((strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )((long)&this_local + 3),
                           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&dont_download);
        if (bVar1) {
          remove_time_critical_piece(this,this_local._4_4_,false);
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::set_piece_priority(piece_index_t const index
		, download_priority_t const priority)
	{
//		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		if (!valid_metadata())
		{
			debug_log("*** SET_PIECE_PRIORITY [ idx: %d prio: %d ignored. "
				"no metadata yet ]", static_cast<int>(index)
				, static_cast<std::uint8_t>(priority));
		}
#endif
		if (!valid_metadata() || is_seed()) return;

		// this call is only valid on torrents with metadata
		if (index < piece_index_t(0) || index >= m_torrent_file->end_piece())
		{
			return;
		}

		need_picker();

		bool const was_finished = is_finished();
		bool const filter_updated = m_picker->set_piece_priority(index, priority);

		update_gauge();

		if (filter_updated)
		{
			update_peer_interest(was_finished);
#ifndef TORRENT_DISABLE_STREAMING
			if (priority == dont_download) remove_time_critical_piece(index);
#endif // TORRENT_DISABLE_STREAMING
		}

	}